

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# realdata_unit.c
# Opt level: O3

_Bool compare_unions(roaring_bitmap_t **rnorun,roaring_bitmap_t **rruns,size_t count)

{
  roaring_bitmap_t *x2;
  _Bool _Var1;
  roaring_bitmap_t *bitmap1;
  roaring_bitmap_t *prVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  _Bool _Var6;
  
  if (1 < count) {
    uVar4 = 2;
    _Var6 = false;
    do {
      bitmap1 = roaring_bitmap_or(rnorun[uVar4 - 2],rnorun[uVar4 - 1]);
      _Var1 = is_union_correct(rnorun[uVar4 - 2],rnorun[uVar4 - 1]);
      if (!_Var1) {
        puts("no-run union incorrect");
        return _Var6;
      }
      prVar2 = roaring_bitmap_or(rruns[uVar4 - 2],rruns[uVar4 - 1]);
      _Var1 = is_union_correct(rruns[uVar4 - 2],rruns[uVar4 - 1]);
      if (!_Var1) {
        pcVar5 = "runs unions incorrect";
LAB_0010356e:
        puts(pcVar5);
        return _Var6;
      }
      _Var1 = slow_bitmap_equals(bitmap1,prVar2);
      if (!_Var1) {
        pcVar5 = "Unions don\'t agree! (slow) ";
        goto LAB_0010356e;
      }
      _Var1 = roaring_bitmap_equals(bitmap1,prVar2);
      if (!_Var1) {
        pcVar5 = "Unions don\'t agree!";
LAB_0010357c:
        puts(pcVar5);
        puts("\n\nbitmap1:");
        roaring_bitmap_printf_describe(bitmap1);
        puts("\n\nbitmap2:");
        roaring_bitmap_printf_describe(prVar2);
        return _Var6;
      }
      roaring_bitmap_free(bitmap1);
      roaring_bitmap_free(prVar2);
      prVar2 = rnorun[uVar4 - 1];
      bitmap1 = roaring_bitmap_copy(rnorun[uVar4 - 2]);
      roaring_bitmap_or_inplace(bitmap1,prVar2);
      _Var1 = is_union_correct(rnorun[uVar4 - 2],rnorun[uVar4 - 1]);
      if (!_Var1) {
        pcVar5 = "[inplace] no-run union incorrect";
        goto LAB_0010356e;
      }
      x2 = rruns[uVar4 - 1];
      prVar2 = roaring_bitmap_copy(rruns[uVar4 - 2]);
      roaring_bitmap_or_inplace(prVar2,x2);
      _Var1 = is_union_correct(rruns[uVar4 - 2],rruns[uVar4 - 1]);
      if (!_Var1) {
        pcVar5 = "[inplace] runs unions incorrect";
        goto LAB_0010356e;
      }
      _Var1 = slow_bitmap_equals(bitmap1,prVar2);
      if (!_Var1) {
        pcVar5 = "[inplace] Unions don\'t agree! (slow) ";
        goto LAB_0010356e;
      }
      _Var1 = roaring_bitmap_equals(bitmap1,prVar2);
      if (!_Var1) {
        pcVar5 = "[inplace] Unions don\'t agree!";
        goto LAB_0010357c;
      }
      roaring_bitmap_free(bitmap1);
      roaring_bitmap_free(prVar2);
      _Var6 = count <= uVar4;
      lVar3 = (1 - count) + uVar4;
      uVar4 = uVar4 + 1;
    } while (lVar3 != 1);
  }
  return true;
}

Assistant:

bool compare_unions(roaring_bitmap_t **rnorun, roaring_bitmap_t **rruns,
                    size_t count) {
    roaring_bitmap_t *tempornorun;
    roaring_bitmap_t *temporruns;
    for (size_t i = 0; i + 1 < count; ++i) {
        tempornorun = roaring_bitmap_or(rnorun[i], rnorun[i + 1]);
        if (!is_union_correct(rnorun[i], rnorun[i + 1])) {
            printf("no-run union incorrect\n");
            return false;
        }
        temporruns = roaring_bitmap_or(rruns[i], rruns[i + 1]);
        if (!is_union_correct(rruns[i], rruns[i + 1])) {
            printf("runs unions incorrect\n");
            return false;
        }
        if (!slow_bitmap_equals(tempornorun, temporruns)) {
            printf("Unions don't agree! (slow) \n");
            return false;
        }

        if (!roaring_bitmap_equals(tempornorun, temporruns)) {
            printf("Unions don't agree!\n");
            printf("\n\nbitmap1:\n");
            roaring_bitmap_printf_describe(tempornorun);  // debug
            printf("\n\nbitmap2:\n");
            roaring_bitmap_printf_describe(temporruns);  // debug
            return false;
        }
        roaring_bitmap_free(tempornorun);
        roaring_bitmap_free(temporruns);
        tempornorun = inplace_union(rnorun[i], rnorun[i + 1]);
        if (!is_union_correct(rnorun[i], rnorun[i + 1])) {
            printf("[inplace] no-run union incorrect\n");
            return false;
        }
        temporruns = inplace_union(rruns[i], rruns[i + 1]);
        if (!is_union_correct(rruns[i], rruns[i + 1])) {
            printf("[inplace] runs unions incorrect\n");
            return false;
        }

        if (!slow_bitmap_equals(tempornorun, temporruns)) {
            printf("[inplace] Unions don't agree! (slow) \n");
            return false;
        }

        if (!roaring_bitmap_equals(tempornorun, temporruns)) {
            printf("[inplace] Unions don't agree!\n");
            printf("\n\nbitmap1:\n");
            roaring_bitmap_printf_describe(tempornorun);  // debug
            printf("\n\nbitmap2:\n");
            roaring_bitmap_printf_describe(temporruns);  // debug
            return false;
        }
        roaring_bitmap_free(tempornorun);
        roaring_bitmap_free(temporruns);
    }
    return true;
}